

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O0

void gimage::anon_unknown_17::loadTiled<unsigned_char>
               (BasicImageIO *io,Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,
               char *name,int ds,long x,long y,long w,long h)

{
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this;
  bool bVar1;
  store_t v;
  byte bVar2;
  int iVar3;
  long *plVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  float *pfVar8;
  int in_ECX;
  char *in_RDX;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RSI;
  long *in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  int d_3;
  float c_1;
  long i_2;
  long k_2;
  int d_2;
  int d_1;
  float c;
  float cy;
  float cx;
  long yy_1;
  long xx_1;
  long i_1;
  long k_1;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> timage_1;
  string tname_1;
  long ph_1;
  long pw_1;
  long py_1;
  long px_1;
  int tx_1;
  int ty_1;
  valarray<float> count;
  valarray<float> value;
  int ty2_1;
  int tx2_1;
  int ty1_1;
  int tx1_1;
  int d;
  long xx;
  long i;
  long yy;
  long k;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> timage;
  string tname;
  long ph;
  long pw;
  long py;
  long px;
  int tx;
  int ty;
  int ty2;
  int tx2;
  int ty1;
  int tx1;
  int depth;
  long height;
  long width;
  long tborder;
  long cheight;
  long theight;
  long cwidth;
  long twidth;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  string suffix;
  string prefix;
  size_t pos;
  string s;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  valarray<float> *this_01;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *pIVar9;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_fffffffffffffab8;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_fffffffffffffac0;
  float *in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaf0;
  float in_stack_fffffffffffffaf4;
  float *in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffb00;
  float in_stack_fffffffffffffb04;
  undefined4 in_stack_fffffffffffffc38;
  int iVar10;
  undefined4 in_stack_fffffffffffffc3c;
  float fVar11;
  undefined8 in_stack_fffffffffffffc40;
  string *in_stack_fffffffffffffc48;
  long lVar12;
  long lVar13;
  int local_3ac;
  int local_3a8;
  float local_3a0;
  float local_39c;
  float local_398;
  float local_394;
  float local_390;
  float local_38c;
  float local_388;
  float local_384;
  float local_380;
  float local_37c;
  long local_378;
  long local_370;
  long local_368;
  long local_360;
  _Self local_358;
  _Self local_350;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> local_348;
  string local_310 [32];
  long local_2f0;
  long local_2e8;
  valarray<float> *local_2e0;
  long local_2d8;
  long local_2d0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2c8;
  long local_2c0 [3];
  long local_2a8 [3];
  int local_290;
  int local_28c;
  valarray<float> local_288;
  valarray<float> local_278;
  int local_268;
  int local_264;
  long local_260 [2];
  int local_24c;
  long local_248 [2];
  int local_238;
  int local_234;
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  _Self local_210;
  _Self local_208;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> local_200;
  string local_1c8 [16];
  long *in_stack_fffffffffffffe48;
  long *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  string *in_stack_fffffffffffffe60;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe68;
  valarray<float> *pvVar14;
  BasicImageIO *in_stack_fffffffffffffe70;
  long local_188;
  long *in_stack_fffffffffffffe80;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar15;
  long *in_stack_fffffffffffffe88;
  long *in_stack_fffffffffffffe90;
  int *in_stack_fffffffffffffe98;
  long local_160 [3];
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  long local_138;
  int local_12c;
  long local_128;
  int local_120;
  undefined1 local_11c [12];
  undefined1 local_110 [16];
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  string local_b0 [32];
  string local_90 [32];
  ulong local_70;
  allocator local_51;
  string local_50 [32];
  long local_30;
  long local_28;
  int local_1c;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_10;
  long *local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,in_RDX,&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_70 = std::__cxx11::string::rfind((char)local_50,0x3a);
  if ((local_70 != 0xffffffffffffffff) &&
     (iVar3 = std::__cxx11::string::compare((ulong)local_50,local_70,(char *)0x2), iVar3 == 0)) {
    local_70 = 0xffffffffffffffff;
  }
  std::__cxx11::string::substr((ulong)local_90,(ulong)local_50);
  std::__cxx11::string::substr((ulong)local_b0,(ulong)local_50);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x17257b);
  pIVar9 = (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)local_11c;
  this_02 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_11c + 4);
  this_01 = (valarray<float> *)local_110;
  this_00 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_110 + 8);
  loadTiledHeader(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                  in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                  in_stack_fffffffffffffe80,in_stack_fffffffffffffe88,in_stack_fffffffffffffe90,
                  in_stack_fffffffffffffe98);
  if (in_stack_00000008 < 1) {
    in_stack_00000008 = (local_110._0_8_ + (long)local_1c + -1) / (long)local_1c;
  }
  if (in_stack_00000010 < 1) {
    in_stack_00000010 = (local_11c._4_8_ + (long)local_1c + -1) / (long)local_1c;
  }
  local_f0 = local_e8 + local_110._8_8_ * -2;
  local_100 = local_f8 + local_110._8_8_ * -2;
  if ((local_1c == 1) && ((float *)local_110._8_8_ == (float *)0x0)) {
    local_128 = 0;
    plVar4 = std::max<long>(&local_128,&local_28);
    local_120 = (int)(*plVar4 / local_f0);
    local_138 = 0;
    plVar4 = std::max<long>(&local_138,&local_30);
    local_12c = (int)(*plVar4 / local_100);
    local_13c = (int)((local_28 + -1 + in_stack_00000008) / local_f0);
    local_140 = (int)((local_30 + -1 + in_stack_00000010) / local_100);
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
               (long)in_stack_fffffffffffffaf8,
               CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
               (long)in_stack_fffffffffffffae8);
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::clear(in_stack_fffffffffffffac0);
    for (local_144 = local_12c; local_144 <= local_140; local_144 = local_144 + 1) {
      for (local_148 = local_120; local_148 <= local_13c; local_148 = local_148 + 1) {
        local_160[1] = 0;
        local_160[0] = local_28 - local_148 * local_f0;
        plVar4 = std::max<long>(local_160 + 1,local_160);
        local_160[2] = *plVar4;
        plVar4 = std::max<long>((long *)&stack0xfffffffffffffe90,(long *)&stack0xfffffffffffffe88);
        lVar12 = *plVar4;
        local_188 = local_e8 - local_160[2];
        plVar4 = std::min<long>(&local_188,(long *)&stack0xfffffffffffffe70);
        psVar15 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)*plVar4;
        plVar4 = std::min<long>((long *)&stack0xfffffffffffffe60,(long *)&stack0xfffffffffffffe58);
        pvVar14 = (valarray<float> *)*plVar4;
        getTileName(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20),
                    (int)in_stack_fffffffffffffc40,
                    (string *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
        Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
                  (pIVar9,(long)this_02,(long)this_01,(int)((ulong)this_00 >> 0x20));
        local_208._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(this_02,(key_type *)this_01);
        local_210._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(this_00);
        bVar1 = std::operator!=(&local_208,&local_210);
        plVar4 = local_8;
        if (bVar1) {
          this_01 = pvVar14;
          this_00 = psVar15;
          uVar5 = std::__cxx11::string::c_str();
          (**(code **)(*plVar4 + 0x30))(plVar4,&local_200,uVar5,1,local_160[2],lVar12);
          for (local_218 = 0; lVar7 = local_218,
              lVar6 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight
                                (&local_200), lVar7 < lVar6; local_218 = local_218 + 1) {
            local_220 = (local_144 * local_100 + lVar12 + local_218) - local_30;
            for (local_228 = 0; lVar7 = local_228,
                lVar6 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth
                                  (&local_200), lVar7 < lVar6; local_228 = local_228 + 1) {
              local_230 = (local_148 * local_f0 + local_160[2] + local_228) - local_28;
              for (local_234 = 0; this = local_10, lVar6 = local_220, lVar7 = local_230,
                  iVar3 = local_234, local_234 < (int)local_11c._0_4_; local_234 = local_234 + 1) {
                v = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                              (&local_200,local_228,local_218,local_234);
                Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                          (this,lVar7,lVar6,iVar3,v);
              }
            }
          }
        }
        Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(pIVar9);
        std::__cxx11::string::~string(local_1c8);
      }
    }
  }
  else {
    local_248[1] = 0;
    local_248[0] = local_28 * local_1c - local_110._8_8_;
    plVar4 = std::max<long>(local_248 + 1,local_248);
    local_238 = (int)(*plVar4 / local_f0);
    local_260[1] = 0;
    local_260[0] = local_30 * local_1c - local_110._8_8_;
    plVar4 = std::max<long>(local_260 + 1,local_260);
    local_24c = (int)(*plVar4 / local_100);
    local_264 = (int)((long)(local_110._8_8_ + (local_28 + -1 + in_stack_00000008) * (long)local_1c)
                     / local_f0);
    local_268 = (int)((long)(local_110._8_8_ + (local_30 + -1 + in_stack_00000010) * (long)local_1c)
                     / local_100);
    std::valarray<float>::valarray(this_01,(size_t)this_00);
    std::valarray<float>::valarray(this_01,(size_t)this_00);
    for (local_28c = local_24c; local_28c <= local_268; local_28c = local_28c + 1) {
      for (local_290 = local_238; local_290 <= local_264; local_290 = local_290 + 1) {
        local_2a8[1] = 0;
        local_2a8[0] = local_110._8_8_ + (local_28 * local_1c - local_290 * local_f0);
        plVar4 = std::max<long>(local_2a8 + 1,local_2a8);
        local_2a8[2] = *plVar4;
        local_2c0[1] = 0;
        local_2c0[0] = local_110._8_8_ + (local_30 * local_1c - local_28c * local_100);
        plVar4 = std::max<long>(local_2c0 + 1,local_2c0);
        local_2c0[2] = *plVar4;
        local_2d0 = local_e8 - local_2a8[2];
        local_2d8 = local_110._8_8_ +
                    (((local_28 + in_stack_00000008) * (long)local_1c - local_2a8[2]) -
                    local_290 * local_f0);
        plVar4 = std::min<long>(&local_2d0,&local_2d8);
        local_2c8 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)*plVar4;
        local_2e8 = local_f8 - local_2c0[2];
        local_2f0 = local_110._8_8_ +
                    (((local_30 + in_stack_00000010) * (long)local_1c - local_2c0[2]) -
                    local_28c * local_100);
        plVar4 = std::min<long>(&local_2e8,&local_2f0);
        local_2e0 = (valarray<float> *)*plVar4;
        getTileName(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20),
                    (int)in_stack_fffffffffffffc40,
                    (string *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
        Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
                  (pIVar9,(long)this_02,(long)this_01,(int)((ulong)this_00 >> 0x20));
        local_350._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(this_02,(key_type *)this_01);
        local_358._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(this_00);
        bVar1 = std::operator!=(&local_350,&local_358);
        plVar4 = local_8;
        if (bVar1) {
          uVar5 = std::__cxx11::string::c_str();
          this_00 = local_2c8;
          this_01 = local_2e0;
          (**(code **)(*plVar4 + 0x30))(plVar4,&local_348,uVar5,1,local_2a8[2],local_2c0[2]);
          for (local_360 = 0; lVar12 = local_360,
              lVar7 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight
                                (&local_348), lVar12 < lVar7; local_360 = local_360 + 1) {
            for (local_368 = 0; lVar12 = local_368,
                lVar7 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth
                                  (&local_348), lVar12 < lVar7; local_368 = local_368 + 1) {
              bVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::isValid
                                (in_stack_fffffffffffffab8,(long)pIVar9,(long)this_02);
              if (bVar1) {
                local_370 = (((local_290 * local_f0 - local_110._8_8_) + local_2a8[2] + local_368) -
                            local_28 * local_1c) / (long)local_1c;
                local_378 = (((local_28c * local_100 - local_110._8_8_) + local_2c0[2] + local_360)
                            - local_30 * local_1c) / (long)local_1c;
                if ((long)local_110._8_8_ < 1) {
                  for (local_3ac = 0; local_3ac < (int)local_11c._0_4_; local_3ac = local_3ac + 1) {
                    bVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                                      (&local_348,local_368,local_360,local_3ac);
                    in_stack_fffffffffffffaf4 = (float)bVar2;
                    in_stack_fffffffffffffaf8 =
                         std::valarray<float>::operator[]
                                   (&local_278,
                                    (local_3ac * in_stack_00000010 + local_378) * in_stack_00000008
                                    + local_370);
                    *in_stack_fffffffffffffaf8 =
                         in_stack_fffffffffffffaf4 + *in_stack_fffffffffffffaf8;
                  }
                  in_stack_fffffffffffffae8 =
                       std::valarray<float>::operator[]
                                 (&local_288,local_378 * in_stack_00000008 + local_370);
                  *in_stack_fffffffffffffae8 = *in_stack_fffffffffffffae8 + 1.0;
                }
                else {
                  local_380 = (float)(local_2a8[2] + local_368) /
                              ((float)(long)local_110._8_8_ + (float)(long)local_110._8_8_);
                  local_384 = (float)(local_e8 + (-local_368 - local_2a8[2])) /
                              ((float)(long)local_110._8_8_ + (float)(long)local_110._8_8_);
                  pfVar8 = std::min<float>(&local_380,&local_384);
                  local_37c = *pfVar8;
                  local_38c = (float)(local_2c0[2] + local_360) /
                              ((float)(long)local_110._8_8_ + (float)(long)local_110._8_8_);
                  local_390 = (float)(local_f8 + (-local_360 - local_2c0[2])) /
                              ((float)(long)local_110._8_8_ + (float)(long)local_110._8_8_);
                  pfVar8 = std::min<float>(&local_38c,&local_390);
                  local_388 = *pfVar8;
                  local_394 = 1e-06;
                  local_398 = 1.0;
                  pfVar8 = std::min<float>(&local_398,&local_37c);
                  pfVar8 = std::max<float>(&local_394,pfVar8);
                  local_37c = *pfVar8;
                  local_39c = 1e-06;
                  local_3a0 = 1.0;
                  pfVar8 = std::min<float>(&local_3a0,&local_388);
                  pfVar8 = std::max<float>(&local_39c,pfVar8);
                  local_388 = *pfVar8;
                  in_stack_fffffffffffffb04 = local_37c * local_388;
                  for (local_3a8 = 0; local_3a8 < (int)local_11c._0_4_; local_3a8 = local_3a8 + 1) {
                    bVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                                      (&local_348,local_368,local_360,local_3a8);
                    pfVar8 = std::valarray<float>::operator[]
                                       (&local_278,
                                        (local_3a8 * in_stack_00000010 + local_378) *
                                        in_stack_00000008 + local_370);
                    *pfVar8 = in_stack_fffffffffffffb04 * (float)bVar2 + *pfVar8;
                  }
                  pfVar8 = std::valarray<float>::operator[]
                                     (&local_288,local_378 * in_stack_00000008 + local_370);
                  *pfVar8 = in_stack_fffffffffffffb04 + *pfVar8;
                }
              }
            }
          }
        }
        Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(pIVar9);
        std::__cxx11::string::~string(local_310);
      }
    }
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
               (long)in_stack_fffffffffffffaf8,
               CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
               (long)in_stack_fffffffffffffae8);
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::clear(in_stack_fffffffffffffac0);
    for (lVar12 = 0; lVar12 < in_stack_00000010; lVar12 = lVar12 + 1) {
      for (lVar7 = 0; lVar7 < in_stack_00000008; lVar7 = lVar7 + 1) {
        pfVar8 = std::valarray<float>::operator[](&local_288,lVar12 * in_stack_00000008 + lVar7);
        fVar11 = *pfVar8;
        if (0.0 < fVar11) {
          iVar3 = 0;
          while (iVar3 < (int)local_11c._0_4_) {
            pIVar9 = local_10;
            iVar10 = iVar3;
            lVar6 = lVar7;
            lVar13 = lVar12;
            pfVar8 = std::valarray<float>::operator[]
                               (&local_278,
                                (iVar3 * in_stack_00000010 + lVar12) * in_stack_00000008 + lVar7);
            Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                      (pIVar9,lVar7,lVar12,iVar3,(store_t)(int)(*pfVar8 / fVar11));
            lVar7 = lVar6;
            lVar12 = lVar13;
            iVar3 = iVar10 + 1;
          }
        }
      }
    }
    std::valarray<float>::~valarray(this_01);
    std::valarray<float>::~valarray(this_01);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x173c0f);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void loadTiled(const BasicImageIO &io, Image<T> &image,
                                 const char *name, int ds, long x, long y, long w, long h)
{
  std::string s=name;
  size_t pos=s.rfind(':');

  if (pos != s.npos && s.compare(pos, 2, ":\\") == 0)
  {
    pos=s.npos;
  }

  // extract prefix and suffix from file name

  std::string prefix=s.substr(0, pos);
  std::string suffix=s.substr(pos+1);

  // get information about the tiled image

  std::set<std::string> list;
  long twidth, cwidth;
  long theight, cheight;
  long tborder;
  long width;
  long height;
  int  depth;

  loadTiledHeader(io, list, prefix, suffix, twidth, theight, tborder, width,
                  height, depth);

  if (w <= 0)
  {
    w=(width+ds-1)/ds;
  }

  if (h <= 0)
  {
    h=(height+ds-1)/ds;
  }

  cwidth=twidth-2*tborder;
  cheight=theight-2*tborder;

  if (ds == 1 && tborder == 0) // loading without downscaling and overlapping tiles
  {
    // determine block of tiles that is involved

    int tx1=std::max(0l, x)/cwidth;
    int ty1=std::max(0l, y)/cheight;
    int tx2=(x+w-1)/cwidth;
    int ty2=(y+h-1)/cheight;

    // go through all tiles

    image.setSize(w, h, depth);
    image.clear();

    for (int ty=ty1; ty<=ty2; ty++)
    {
      for (int tx=tx1; tx<=tx2; tx++)
      {
        // load part of tile

        long px=std::max(0l, x-tx*cwidth);
        long py=std::max(0l, y-ty*cheight);
        long pw=std::min(twidth-px, x+w-px-tx*cwidth);
        long ph=std::min(theight-py, y+h-py-ty*cheight);

        std::string   tname=getTileName(prefix, ty, tx, suffix);
        Image<T> timage(pw, ph, depth);

        if (list.find(tname) != list.end())
        {
          io.load(timage, tname.c_str(), 1, px, py, pw, ph);

          // copy part of tile with downscaling

          for (long k=0; k<timage.getHeight(); k++)
          {
            const long yy=ty*cheight+py+k-y;

            for (long i=0; i<timage.getWidth(); i++)
            {
              const long xx=tx*cwidth+px+i-x;

              for (int d=0; d<depth; d++)
              {
                image.set(xx, yy, d, timage.get(i, k, d));
              }
            }
          }
        }
      }
    }
  }
  else
  {
    // determine block of tiles that is involved

    int tx1=std::max(0l, x*ds-tborder)/cwidth;
    int ty1=std::max(0l, y*ds-tborder)/cheight;
    int tx2=((x+w-1)*ds+tborder)/cwidth;
    int ty2=((y+h-1)*ds+tborder)/cheight;

    // go through all tiles

    std::valarray<float> value(w*h*depth);
    std::valarray<float> count(w*h);

    for (int ty=ty1; ty<=ty2; ty++)
    {
      for (int tx=tx1; tx<=tx2; tx++)
      {
        // load part of tile

        long px=std::max(0l, x*ds-(tx*cwidth-tborder));
        long py=std::max(0l, y*ds-(ty*cheight-tborder));
        long pw=std::min(twidth-px, (x+w)*ds-px-(tx*cwidth-tborder));
        long ph=std::min(theight-py, (y+h)*ds-py-(ty*cheight-tborder));

        std::string   tname=getTileName(prefix, ty, tx, suffix);
        Image<T> timage(pw, ph, depth);

        if (list.find(tname) != list.end())
        {
          io.load(timage, tname.c_str(), 1, px, py, pw, ph);

          // copy part of tile with downscaling

          for (long k=0; k<timage.getHeight(); k++)
          {
            for (long i=0; i<timage.getWidth(); i++)
            {
              if (timage.isValid(i, k))
              {
                long xx=(tx*cwidth-tborder+px+i-x*ds)/ds;
                long yy=(ty*cheight-tborder+py+k-y*ds)/ds;

                if (tborder > 0)
                {
                  float cx=std::min((px+i)/(2.0f*tborder), (twidth-px-i)/(2.0f*tborder));
                  float cy=std::min((py+k)/(2.0f*tborder), (theight-py-k)/(2.0f*tborder));

                  cx=std::max(1e-6f, std::min(1.0f, cx));
                  cy=std::max(1e-6f, std::min(1.0f, cy));

                  float c=cx*cy;

                  for (int d=0; d<depth; d++)
                  {
                    value[(d*h+yy)*w+xx]+=c*static_cast<float>(timage.get(i, k, d));
                  }

                  count[yy*w+xx]+=c;
                }
                else
                {
                  for (int d=0; d<depth; d++)
                  {
                    value[(d*h+yy)*w+xx]+=static_cast<float>(timage.get(i, k, d));
                  }

                  count[yy*w+xx]++;
                }
              }
            }
          }
        }
      }
    }

    // copy result to target image

    image.setSize(w, h, depth);
    image.clear();

    for (long k=0; k<h; k++)
    {
      for (long i=0; i<w; i++)
      {
        float c=count[k*w+i];

        if (c > 0)
        {
          for (int d=0; d<depth; d++)
          {
            image.set(i, k, d, static_cast<typename Image<T>::store_t>(value[(d*h+k)*w+i]/c));
          }
        }
      }
    }
  }
}